

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall
Js::ScriptContext::AddCalleeSourceInfoToList(ScriptContext *this,Utf8SourceInfo *sourceInfo)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *pWVar1;
  code *pcVar2;
  ulong uVar3;
  bool bVar4;
  undefined4 *puVar5;
  Recycler *alloc;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *pLVar6;
  ulong uVar7;
  ulong uVar8;
  Recycler *pRVar9;
  undefined1 local_50 [8];
  TrackAllocData data;
  RecyclerWeakReference<Js::Utf8SourceInfo> *sourceInfoWeakRef;
  
  if (sourceInfo == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e1,"(sourceInfo)","sourceInfo");
    if (!bVar4) goto LAB_0078fdaa;
    *puVar5 = 0;
    pRVar9 = this->recycler;
    sourceInfo = (Utf8SourceInfo *)0x0;
  }
  else {
    pRVar9 = this->recycler;
  }
  data.line = 0;
  data._36_4_ = 0;
  bVar4 = Memory::WeakReferenceHashTable<PrimePolicy>::FindOrAdd
                    (&pRVar9->weakReferenceMap,(char *)sourceInfo,pRVar9,
                     (RecyclerWeakReferenceBase **)&data.line);
  if (!bVar4) {
    *(undefined ***)(data._32_8_ + 0x20) = &Utf8SourceInfo::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(pRVar9,(RecyclerWeakReferenceBase *)data._32_8_);
  }
  if (data._32_8_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x19e5,"(sourceInfoWeakRef)","sourceInfoWeakRef");
    if (!bVar4) {
LAB_0078fdaa:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->calleeUtf8SourceInfoList;
  if ((this->calleeUtf8SourceInfoList).ptr ==
      (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
       *)0x0) {
    pRVar9 = this->recycler;
    local_50 = (undefined1  [8])
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d7f97f;
    data.filename._0_4_ = 0x19ea;
    alloc = Memory::Recycler::TrackAllocInfo(pRVar9,(TrackAllocData *)local_50);
    pLVar6 = (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x387914);
    (pLVar6->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).alloc = pRVar9;
    (pLVar6->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014dc280;
    pLVar6->increment = 4;
    (pLVar6->removePolicy).
    super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
         = -1;
    (pLVar6->removePolicy).lastWeakReferenceCleanupId = pRVar9->weakReferenceCleanupId;
    (pLVar6->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *)0x0;
    (pLVar6->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    pLVar6->length = 0;
    Memory::
    RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
    ::Root(this_00,pLVar6,pRVar9);
  }
  pLVar6 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(this_00);
  uVar7 = (ulong)(pLVar6->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                 ).count;
  if (0 < (long)uVar7) {
    pWVar1 = (pLVar6->
             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
             ).buffer.ptr;
    if ((RecyclerWeakReference<Js::Utf8SourceInfo> *)data._32_8_ == pWVar1->ptr) {
      return;
    }
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar7 == uVar8) break;
      uVar3 = uVar8 + 1;
    } while ((RecyclerWeakReference<Js::Utf8SourceInfo> *)data._32_8_ != pWVar1[uVar8].ptr);
    if (uVar8 < uVar7) {
      return;
    }
  }
  pLVar6 = Memory::
           RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>_>
           ::operator->(this_00);
  JsUtil::
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  ::Add(pLVar6,(RecyclerWeakReference<Js::Utf8SourceInfo> **)&data.line);
  return;
}

Assistant:

void ScriptContext::AddCalleeSourceInfoToList(Utf8SourceInfo* sourceInfo)
    {
        Assert(sourceInfo);

        RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef = nullptr;
        this->GetRecycler()->FindOrCreateWeakReferenceHandle(sourceInfo, &sourceInfoWeakRef);
        Assert(sourceInfoWeakRef);

        if (!calleeUtf8SourceInfoList)
        {
            Recycler *recycler = this->GetRecycler();
            calleeUtf8SourceInfoList.Root(RecyclerNew(recycler, CalleeSourceList, recycler), recycler);
        }

        if (!calleeUtf8SourceInfoList->Contains(sourceInfoWeakRef))
        {
            calleeUtf8SourceInfoList->Add(sourceInfoWeakRef);
        }
    }